

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

void slang::ast::createCondGenBlock
               (Compilation *compilation,SyntaxNode *syntax,ASTContext *context,
               uint32_t constructIndex,bool isInstantiated,
               SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  Scope *scope;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  IfGenerateSyntax *syntax_01;
  CaseGenerateSyntax *syntax_02;
  GenerateBlockSymbol *this;
  GenerateBlockSymbol *block;
  SourceLocation loc;
  string_view name;
  bool local_69;
  SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *local_68;
  uint32_t local_5c;
  Token local_58;
  SourceLocation local_48;
  string_view local_40;
  
  local_68 = results;
  local_69 = isInstantiated;
  local_5c = constructIndex;
  if (syntax->kind == CaseGenerate) {
    syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(syntax);
    GenerateBlockSymbol::fromSyntax
              (compilation,syntax_02,context,constructIndex,isInstantiated,local_68);
    return;
  }
  if (syntax->kind == IfGenerate) {
    syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(syntax);
    GenerateBlockSymbol::fromSyntax
              (compilation,syntax_01,context,constructIndex,isInstantiated,local_68);
    return;
  }
  local_40 = getGenerateBlockName(syntax);
  local_58 = slang::syntax::SyntaxNode::getFirstToken(syntax);
  local_48 = parsing::Token::location(&local_58);
  this = BumpAllocator::
         emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool&>
                   (&compilation->super_BumpAllocator,compilation,&local_40,&local_48,&local_5c,
                    &local_69);
  local_58._0_8_ = this;
  (this->super_Symbol).originatingSyntax = syntax;
  scope = (context->scope).ptr;
  if (scope == (Scope *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
              );
  }
  psVar1 = &attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  ;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
      size_ == 0 || psVar1->data_ != (pointer)0x0) {
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
    SmallVectorBase<slang::ast::GenerateBlockSymbol*>::
    emplace_back<slang::ast::GenerateBlockSymbol*const&>
              ((SmallVectorBase<slang::ast::GenerateBlockSymbol*> *)local_68,
               (GenerateBlockSymbol **)&local_58);
    if (local_69 == true) {
      addBlockMembers((GenerateBlockSymbol *)local_58._0_8_,syntax);
    }
    return;
  }
  std::terminate();
}

Assistant:

static void createCondGenBlock(Compilation& compilation, const SyntaxNode& syntax,
                               const ASTContext& context, uint32_t constructIndex,
                               bool isInstantiated,
                               const SyntaxList<AttributeInstanceSyntax>& attributes,
                               SmallVectorBase<GenerateBlockSymbol*>& results) {
    // [27.5] If a generate block in a conditional generate construct consists of only one item
    // that is itself a conditional generate construct and if that item is not surrounded by
    // begin-end keywords, then this generate block is not treated as a separate scope. The
    // generate construct within this block is said to be directly nested. The generate blocks
    // of the directly nested construct are treated as if they belong to the outer construct.
    switch (syntax.kind) {
        case SyntaxKind::IfGenerate:
            GenerateBlockSymbol::fromSyntax(compilation, syntax.as<IfGenerateSyntax>(), context,
                                            constructIndex, isInstantiated, results);
            return;
        case SyntaxKind::CaseGenerate:
            GenerateBlockSymbol::fromSyntax(compilation, syntax.as<CaseGenerateSyntax>(), context,
                                            constructIndex, isInstantiated, results);
            return;
        default:
            break;
    }

    string_view name = getGenerateBlockName(syntax);
    SourceLocation loc = syntax.getFirstToken().location();

    auto block = compilation.emplace<GenerateBlockSymbol>(compilation, name, loc, constructIndex,
                                                          isInstantiated);
    block->setSyntax(syntax);
    block->setAttributes(*context.scope, attributes);
    results.push_back(block);

    if (isInstantiated)
        addBlockMembers(*block, syntax);
}